

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void rewindPaths(int previousDecisionLevel,int newDecisionLevel,RewindStyle rewindStyle,long param_4
                )

{
  char cVar1;
  size_t __n;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  ulong uVar2;
  undefined1 *puVar3;
  int iVar4;
  int iVar5;
  Connector *pCVar6;
  undefined1 local_d8 [16];
  int32_t local_c8;
  ulong local_c4;
  int32_t local_bc;
  int local_b8;
  undefined8 local_b4;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  bool local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  bool local_60;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  if (rewindStyle == REWIND_SEND_SKIPPED) {
    std::vector<int,_std::allocator<int>_>::resize
              (&nodepath,
               (long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)previousDecisionLevel + -1]);
    std::vector<int,_std::allocator<int>_>::resize
              (&altpath,(long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[(long)previousDecisionLevel + -1] -
                        1);
    while( true ) {
      uVar2 = (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if ((int)(uVar2 >> 2) <=
          decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[newDecisionLevel]) break;
      iVar4 = nextnodeid + 1;
      if (nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        __n = 0xffffffff;
      }
      else {
        __n = (size_t)*(uint *)((long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + (uVar2 - 4));
      }
      if (altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar5 = 0;
      }
      else {
        iVar5 = altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] + 1;
      }
      __buf = (void *)CONCAT71((int7)((ulong)altpath.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish >> 8),
                               so.print_nodes);
      if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
        puVar3 = (undefined1 *)CONCAT44(engine.restart_count,nextnodeid);
        local_d8._0_8_ = profilerConnector;
        local_c8 = 0;
        local_bc = 0;
        local_b4._0_4_ = 0;
        local_b4._4_4_ = SKIPPED;
        local_a8._M_p = (pointer)&local_98;
        local_a0 = 0;
        local_98._M_local_buf[0] = '\0';
        local_88 = false;
        local_80._M_p = (pointer)&local_70;
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        local_60 = false;
        local_58._M_p = (pointer)&local_48;
        local_50 = 0;
        local_48._M_local_buf[0] = '\0';
        local_38 = false;
        pCVar6 = profilerConnector;
        nextnodeid = iVar4;
        local_d8._8_8_ = puVar3;
        local_c4 = __n;
        local_b8 = iVar5;
        if (so.print_nodes != false) {
          cVar1 = std::__basic_file<char>::is_open();
          if (cVar1 == '\0') {
            std::ofstream::open(node_stream,0x1b16f8);
          }
          puVar3 = node_stream;
          printNode<cpprofiler::Node&>((Node *)local_d8,(ostream *)node_stream);
          __buf = extraout_RDX;
          if (so.debug == true) {
            puVar3 = (undefined1 *)&std::cerr;
            printNode<cpprofiler::Node&>((Node *)local_d8,(ostream *)&std::cerr);
            __buf = extraout_RDX_00;
          }
        }
        cpprofiler::Node::send((Node *)local_d8,(int)puVar3,__buf,__n,(int)pCVar6);
        cpprofiler::Node::~Node((Node *)local_d8);
        uVar2 = (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        iVar4 = nextnodeid;
      }
      nextnodeid = iVar4;
      std::vector<int,_std::allocator<int>_>::resize(&nodepath,((long)uVar2 >> 2) - 1);
      std::vector<int,_std::allocator<int>_>::resize
                (&altpath,((long)altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2) - 1);
    }
    return;
  }
  if (rewindStyle == REWIND_OMIT_SKIPPED) {
    std::vector<int,_std::allocator<int>_>::resize
              (&nodepath,
               (long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[newDecisionLevel]);
    std::vector<int,_std::allocator<int>_>::resize
              (&altpath,(long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[newDecisionLevel] - 1);
    return;
  }
  abort();
}

Assistant:

void rewindPaths(int previousDecisionLevel, int newDecisionLevel, RewindStyle rewindStyle,
								 long /*timestamp*/) {
	switch (rewindStyle) {
		case REWIND_OMIT_SKIPPED:
			nodepath.resize(decisionLevelTip[newDecisionLevel]);
			altpath.resize(decisionLevelTip[newDecisionLevel] - 1);
			break;
		case REWIND_SEND_SKIPPED:
#if DEBUG_VERBOSE
			std::cerr << "rewinding to level " << newDecisionLevel << "\n";
			std::cerr << "before, nodepath is: " << showVector(nodepath) << "\n";
			std::cerr << "     and altpath is: " << showVector(altpath) << "\n";
			std::cerr << "       and dlTip is: " << showVector(decisionLevelTip) << "\n";
#endif

			// The tip of the nodepath and altpath lead us to the node
			// that failed.  (That is, the last element of nodepath is the
			// id of the node that failed.)  We first unwind that tip to
			// the next decision level, so that we don't send a "skipped
			// child" for that node or any others at this level.
			nodepath.resize(decisionLevelTip[previousDecisionLevel - 1]);
			altpath.resize(decisionLevelTip[previousDecisionLevel - 1] - 1);

			// Now walk back through the decision levels, sending a
			// "skipped" node for each child that was never visited.
			while (static_cast<int>(nodepath.size()) > decisionLevelTip[newDecisionLevel]) {
				const int nodeid = nextnodeid;
				nextnodeid++;
				const int parent = (nodepath.empty()) ? (-1) : (nodepath[nodepath.size() - 1]);
				int myalt = (altpath.empty()) ? (-1) : (altpath[altpath.size() - 1]);

				// myalt is the alternative that led to the failure; the
				// skipped node is conceptually the next alternative.
				myalt++;

#ifdef HAS_PROFILER
				if (doProfiling()) {
					sendNode(profilerConnector->createNode({nodeid, engine.restart_count, 0}, {parent, 0, 0},
																								 myalt, 0, cpprofiler::NodeStatus::SKIPPED));
					//    .set_decision_level(currentDecisionLevel)
					//    .set_time(timestamp));
				}
#endif
				nodepath.resize(nodepath.size() - 1);
				altpath.resize(altpath.size() - 1);
			}
#if DEBUG_VERBOSE
			std::cerr << "after, nodepath is: " << showVector(nodepath) << "\n";
			std::cerr << "    and altpath is: " << showVector(altpath) << "\n";
			std::cerr << "       and dlTip is: " << showVector(decisionLevelTip) << "\n";
#endif
			break;
		default:
			std::abort();
	}
}